

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O3

bool __thiscall bssl::NameConstraints::IsPermittedIP(NameConstraints *this,Input ip)

{
  pointer ppVar1;
  bool bVar2;
  pair<bssl::der::Input,_bssl::der::Input> *excluded_ip;
  pointer ppVar3;
  
  ppVar1 = (this->excluded_subtrees_).ip_address_ranges.
           super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->excluded_subtrees_).ip_address_ranges.
                super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    bVar2 = IPAddressMatchesWithNetmask
                      (ip,(Input)(ppVar3->first).data_,(Input)(ppVar3->second).data_);
    if (bVar2) goto LAB_004a30e5;
  }
  bVar2 = true;
  if (((this->permitted_subtrees_).present_name_types & 0x80) != 0) {
    ppVar3 = (this->permitted_subtrees_).ip_address_ranges.
             super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->permitted_subtrees_).ip_address_ranges.
             super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar3 == ppVar1) {
LAB_004a30e5:
      bVar2 = false;
    }
    else {
      do {
        bVar2 = IPAddressMatchesWithNetmask
                          (ip,(Input)(ppVar3->first).data_,(Input)(ppVar3->second).data_);
        if (bVar2) {
          return bVar2;
        }
        ppVar3 = ppVar3 + 1;
      } while (ppVar3 != ppVar1);
    }
  }
  return bVar2;
}

Assistant:

bool NameConstraints::IsPermittedIP(der::Input ip) const {
  for (const auto &excluded_ip : excluded_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, excluded_ip.first,
                                    excluded_ip.second)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_IP_ADDRESS)) {
    return true;
  }

  for (const auto &permitted_ip : permitted_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, permitted_ip.first,
                                    permitted_ip.second)) {
      return true;
    }
  }

  return false;
}